

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall Bech32Test_map_data_Test::~Bech32Test_map_data_Test(Bech32Test_map_data_Test *this)

{
  Bech32Test_map_data_Test *this_local;
  
  ~Bech32Test_map_data_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, map_data) {
    std::string str("ABC1acd");
    std::vector<unsigned char> dp = extractDataPart(str);
    ASSERT_NO_THROW(mapDP(dp));
    ASSERT_EQ(dp[0], '\x1d');
    ASSERT_EQ(dp[1], '\x18');
    ASSERT_EQ(dp[2], '\x0d');

    str = "ACB1DEF";
    dp = extractDataPart(str);
    ASSERT_NO_THROW(mapDP(dp));
    ASSERT_EQ(dp[0], '\x0d');
    ASSERT_EQ(dp[1], '\x19');
    ASSERT_EQ(dp[2], '\x09');

    str = "ACB1abc";
    dp = extractDataPart(str);
    ASSERT_THROW(mapDP(dp), std::runtime_error); // throws because 'b' is invalid character
}